

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O0

Scale * icu_63::number::Scale::byDoubleAndPowerOfTen
                  (Scale *__return_storage_ptr__,double multiplicand,int32_t power)

{
  int32_t magnitude;
  UBool UVar1;
  DecNum *pDVar2;
  undefined4 in_register_00000034;
  DecNum *local_48;
  LocalPointerBase<icu_63::number::impl::DecNum> local_28;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UErrorCode localError;
  int32_t power_local;
  double multiplicand_local;
  
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._0_4_ = U_ZERO_ERROR;
  decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_ = power;
  pDVar2 = (DecNum *)UMemory::operator_new((UMemory *)0x60,CONCAT44(in_register_00000034,power));
  local_48 = (DecNum *)0x0;
  if (pDVar2 != (DecNum *)0x0) {
    impl::DecNum::DecNum(pDVar2);
    local_48 = pDVar2;
  }
  LocalPointer<icu_63::number::impl::DecNum>::LocalPointer
            ((LocalPointer<icu_63::number::impl::DecNum> *)&local_28,local_48,(UErrorCode *)&decnum)
  ;
  UVar1 = ::U_FAILURE((UErrorCode)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
  if (UVar1 == '\0') {
    pDVar2 = LocalPointerBase<icu_63::number::impl::DecNum>::operator->(&local_28);
    impl::DecNum::setTo(pDVar2,multiplicand,(UErrorCode *)&decnum);
    UVar1 = ::U_FAILURE((UErrorCode)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr)
    ;
    magnitude = decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr._4_4_;
    if (UVar1 == '\0') {
      pDVar2 = LocalPointerBase<icu_63::number::impl::DecNum>::orphan(&local_28);
      Scale(__return_storage_ptr__,magnitude,pDVar2);
    }
    else {
      Scale(__return_storage_ptr__,
            (UErrorCode)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
    }
  }
  else {
    Scale(__return_storage_ptr__,
          (UErrorCode)decnum.super_LocalPointerBase<icu_63::number::impl::DecNum>.ptr);
  }
  LocalPointer<icu_63::number::impl::DecNum>::~LocalPointer
            ((LocalPointer<icu_63::number::impl::DecNum> *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDoubleAndPowerOfTen(double multiplicand, int32_t power) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {power, decnum.orphan()};
}